

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cortex_socket.cpp
# Opt level: O0

int GetHostByAddr(uchar *Address,char *szName)

{
  hostent *phVar1;
  char *in_RSI;
  void *in_RDI;
  hostent *pHostEnt;
  int local_4;
  
  phVar1 = gethostbyaddr(in_RDI,4,2);
  if (phVar1 == (hostent *)0x0) {
    LogMessage(1,"Unable to get CortexHost name information");
    local_4 = 3;
  }
  else {
    strcpy(in_RSI,phVar1->h_name);
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int GetHostByAddr(unsigned char Address[4], char *szName)
{
    hostent* pHostEnt;

    pHostEnt = gethostbyaddr((char*)Address, 4, PF_INET);

    if (pHostEnt == NULL)
    {
        LogMessage(VL_Error, "Unable to get CortexHost name information");
        return RC_NetworkError;
    }
    strcpy(szName, pHostEnt->h_name);

    return RC_Okay;
}